

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::SingleCapPipeline::~SingleCapPipeline
          (SingleCapPipeline *this)

{
  SingleCapPipeline *this_local;
  
  (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)&PTR_addRef_00d8c530;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_00d8c568;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own(&this->cap);
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

SingleCapPipeline(kj::Own<ClientHook>&& cap)
        : cap(kj::mv(cap)) {}